

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_ssse3.h
# Opt level: O0

__m128i convolve8_8_ssse3(__m128i *s,__m128i *f)

{
  longlong in_RDX;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  __m128i alVar5;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  __m128i sum2;
  __m128i sum1;
  __m128i x3;
  __m128i x2;
  __m128i x1;
  __m128i x0;
  __m128i k_64;
  short sStack_10;
  short sStack_e;
  short sStack_c;
  short sStack_a;
  __m128i *f_local;
  
  auVar1 = pmaddubsw((undefined1  [16])*s,(undefined1  [16])*f);
  auVar2 = pmaddubsw((undefined1  [16])s[1],(undefined1  [16])f[1]);
  auVar3 = pmaddubsw((undefined1  [16])s[2],(undefined1  [16])f[2]);
  auVar4 = pmaddubsw((undefined1  [16])s[3],(undefined1  [16])f[3]);
  k_64[1]._0_2_ = auVar1._0_2_;
  k_64[1]._2_2_ = auVar1._2_2_;
  k_64[1]._4_2_ = auVar1._4_2_;
  k_64[1]._6_2_ = auVar1._6_2_;
  sStack_10 = auVar1._8_2_;
  sStack_e = auVar1._10_2_;
  sStack_c = auVar1._12_2_;
  sStack_a = auVar1._14_2_;
  x0[1]._0_2_ = auVar3._0_2_;
  x0[1]._2_2_ = auVar3._2_2_;
  x0[1]._4_2_ = auVar3._4_2_;
  x0[1]._6_2_ = auVar3._6_2_;
  k_64[0]._0_2_ = auVar3._8_2_;
  k_64[0]._2_2_ = auVar3._10_2_;
  k_64[0]._4_2_ = auVar3._12_2_;
  k_64[0]._6_2_ = auVar3._14_2_;
  x1[1]._0_2_ = auVar2._0_2_;
  x1[1]._2_2_ = auVar2._2_2_;
  x1[1]._4_2_ = auVar2._4_2_;
  x1[1]._6_2_ = auVar2._6_2_;
  x0[0]._0_2_ = auVar2._8_2_;
  x0[0]._2_2_ = auVar2._10_2_;
  x0[0]._4_2_ = auVar2._12_2_;
  x0[0]._6_2_ = auVar2._14_2_;
  x2[1]._0_2_ = auVar4._0_2_;
  x2[1]._2_2_ = auVar4._2_2_;
  x2[1]._4_2_ = auVar4._4_2_;
  x2[1]._6_2_ = auVar4._6_2_;
  x1[0]._0_2_ = auVar4._8_2_;
  x1[0]._2_2_ = auVar4._10_2_;
  x1[0]._4_2_ = auVar4._12_2_;
  x1[0]._6_2_ = auVar4._14_2_;
  local_1c8._0_4_ =
       CONCAT22(k_64[1]._2_2_ + x0[1]._2_2_ + 0x40,(short)k_64[1] + (short)x0[1] + 0x40);
  local_1c8._0_6_ = CONCAT24(k_64[1]._4_2_ + x0[1]._4_2_ + 0x40,(undefined4)local_1c8);
  local_1c8 = CONCAT26(k_64[1]._6_2_ + x0[1]._6_2_ + 0x40,(undefined6)local_1c8);
  uStack_1c0._0_2_ = sStack_10 + (short)k_64[0] + 0x40;
  uStack_1c0._2_2_ = sStack_e + k_64[0]._2_2_ + 0x40;
  uStack_1c0._4_2_ = sStack_c + k_64[0]._4_2_ + 0x40;
  uStack_1c0._6_2_ = sStack_a + k_64[0]._6_2_ + 0x40;
  auVar1._2_2_ = x1[1]._2_2_ + x2[1]._2_2_;
  auVar1._0_2_ = (short)x1[1] + (short)x2[1];
  auVar1._4_2_ = x1[1]._4_2_ + x2[1]._4_2_;
  auVar1._6_2_ = x1[1]._6_2_ + x2[1]._6_2_;
  auVar1._10_2_ = x0[0]._2_2_ + x1[0]._2_2_;
  auVar1._8_2_ = (short)x0[0] + (short)x1[0];
  auVar1._12_2_ = x0[0]._4_2_ + x1[0]._4_2_;
  auVar1._14_2_ = x0[0]._6_2_ + x1[0]._6_2_;
  auVar2._8_8_ = uStack_1c0;
  auVar2._0_8_ = local_1c8;
  auVar1 = paddsw(auVar2,auVar1);
  psraw(auVar1,ZEXT416(7));
  alVar5[1] = in_RDX;
  alVar5[0] = 7;
  return alVar5;
}

Assistant:

static inline __m128i convolve8_8_ssse3(const __m128i *const s,
                                        const __m128i *const f) {
  // multiply 2 adjacent elements with the filter and add the result
  const __m128i k_64 = _mm_set1_epi16(1 << 6);
  const __m128i x0 = _mm_maddubs_epi16(s[0], f[0]);
  const __m128i x1 = _mm_maddubs_epi16(s[1], f[1]);
  const __m128i x2 = _mm_maddubs_epi16(s[2], f[2]);
  const __m128i x3 = _mm_maddubs_epi16(s[3], f[3]);
  __m128i sum1, sum2;

  // sum the results together, saturating only on the final step
  // adding x0 with x2 and x1 with x3 is the only order that prevents
  // outranges for all filters
  sum1 = _mm_add_epi16(x0, x2);
  sum2 = _mm_add_epi16(x1, x3);
  // add the rounding offset early to avoid another saturated add
  sum1 = _mm_add_epi16(sum1, k_64);
  sum1 = _mm_adds_epi16(sum1, sum2);
  // shift by 7 bit each 16 bit
  sum1 = _mm_srai_epi16(sum1, 7);
  return sum1;
}